

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

double calculator::ExpressionParser<__int128>::pow(double __x,double __y)

{
  ulong uVar1;
  ulong in_RCX;
  ulong in_RDX;
  bool bVar2;
  
  for (; (long)(ulong)(in_RDX == 0) <= (long)in_RCX; in_RDX = uVar1 | in_RDX >> 1) {
    if ((in_RDX & 1) != 0) {
      bVar2 = in_RDX != 0;
      in_RDX = in_RDX - 1;
      in_RCX = (in_RCX - 1) + (ulong)bVar2;
    }
    uVar1 = in_RCX << 0x3f;
    in_RCX = in_RCX >> 1;
  }
  return __x;
}

Assistant:

static T pow(T x, T n)
  {
    T res = 1;

    while (n > 0)
    {
      if (n % 2 != 0)
      {
        res *= x;
        n -= 1;
      }
      n /= 2;

      if (n > 0)
        x *= x;
    }

    return res;
  }